

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool closed,float thickness)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  float fVar8;
  float fVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  ImVec2 IVar12;
  ImDrawVert *pIVar13;
  ImVec4 *pIVar14;
  int iVar15;
  ImVec2 IVar16;
  byte bVar17;
  ulong uVar18;
  undefined8 *puVar19;
  ImDrawIdx IVar20;
  ImDrawIdx IVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  int iVar26;
  uint uVar27;
  ImDrawIdx *pIVar28;
  ImDrawIdx IVar29;
  undefined7 in_register_00000081;
  ImDrawIdx IVar30;
  long lVar31;
  ImDrawIdx IVar32;
  uint uVar33;
  ImVec2 IVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float afStack_a8 [2];
  undefined8 uStack_a0;
  ImVec2 local_98;
  ImVec2 IStack_90;
  ImVec2 local_88;
  ImVec2 local_80;
  float local_78;
  int local_64;
  undefined4 local_60;
  int local_5c;
  float local_58;
  ulong local_48;
  float *local_40;
  uint local_34;
  
  if (points_count < 2) {
    return;
  }
  local_88 = (ImVec2)(ulong)(uint)points_count;
  IVar12 = this->_Data->TexUvWhitePixel;
  local_80 = (ImVec2)(ulong)(points_count - 1U);
  uVar22 = points_count - 1U;
  if (closed) {
    uVar22 = points_count;
  }
  local_48 = (ulong)(uint)points_count;
  if ((this->Flags & 1U) == 0) {
    uStack_a0 = 0x1406ff;
    local_58 = thickness;
    PrimReserve(this,uVar22 * 6,uVar22 << 2);
    for (uVar18 = 1; uVar18 - uVar22 != 1; uVar18 = uVar18 + 1) {
      uVar23 = uVar18 & 0xffffffff;
      if (local_48 == uVar18) {
        uVar23 = 0;
      }
      fVar8 = points[uVar18 - 1].x;
      fVar4 = points[uVar23].x - fVar8;
      fVar9 = points[uVar18 - 1].y;
      fVar3 = points[uVar23].y - fVar9;
      fVar35 = fVar4 * fVar4 + fVar3 * fVar3;
      if (0.0 < fVar35) {
        fVar35 = 1.0 / SQRT(fVar35);
        fVar3 = fVar3 * fVar35;
        fVar4 = fVar4 * fVar35;
      }
      fVar3 = fVar3 * local_58 * 0.5;
      fVar4 = fVar4 * local_58 * 0.5;
      pIVar13 = this->_VtxWritePtr;
      IVar34.y = fVar9 - fVar4;
      IVar34.x = fVar8 + fVar3;
      pIVar13->pos = IVar34;
      pIVar13->uv = IVar12;
      pIVar13 = this->_VtxWritePtr;
      pIVar13->col = col;
      pIVar13[1].pos.x = points[uVar23].x + fVar3;
      pIVar13[1].pos.y = points[uVar23].y - fVar4;
      pIVar13[1].uv = IVar12;
      pIVar13 = this->_VtxWritePtr;
      pIVar13[1].col = col;
      pIVar13[2].pos.x = points[uVar23].x - fVar3;
      pIVar13[2].pos.y = points[uVar23].y + fVar4;
      pIVar13[2].uv = IVar12;
      pIVar13 = this->_VtxWritePtr;
      pIVar13[2].col = col;
      pIVar13[3].pos.x = points[uVar18 - 1].x - fVar3;
      pIVar13[3].pos.y = points[uVar18 - 1].y + fVar4;
      pIVar13[3].uv = IVar12;
      pIVar13 = this->_VtxWritePtr;
      pIVar13[3].col = col;
      this->_VtxWritePtr = pIVar13 + 4;
      uVar27 = this->_VtxCurrentIdx;
      pIVar28 = this->_IdxWritePtr;
      IVar21 = (ImDrawIdx)uVar27;
      *pIVar28 = IVar21;
      pIVar28[1] = IVar21 + 1;
      pIVar28[2] = IVar21 + 2;
      pIVar28[3] = IVar21;
      pIVar28[4] = IVar21 + 2;
      pIVar28[5] = IVar21 + 3;
      this->_IdxWritePtr = pIVar28 + 6;
      this->_VtxCurrentIdx = uVar27 + 4;
    }
    return;
  }
  uVar18 = 1;
  local_78 = thickness;
  if (thickness <= 1.0) {
    local_78 = 1.0;
  }
  local_5c = (int)local_78;
  local_98.x = local_78 - (float)local_5c;
  bVar17 = local_98.x <= 1e-05 & local_5c < 0x3f & (byte)this->Flags >> 1;
  local_58 = (float)CONCAT31(local_58._1_3_,bVar17);
  local_34 = CONCAT31(local_34._1_3_,thickness <= 1.0);
  iVar15 = 0x12;
  if (thickness <= 1.0) {
    iVar15 = 0xc;
  }
  local_64 = points_count * 3;
  if (1.0 < thickness) {
    local_64 = points_count * 4;
  }
  iVar26 = 6;
  if (bVar17 == 0) {
    iVar26 = iVar15;
  }
  if (bVar17 != 0) {
    local_64 = points_count * 2;
  }
  local_60 = (undefined4)CONCAT71(in_register_00000081,closed);
  uStack_a0 = 0x140910;
  local_40 = (float *)(ulong)uVar22;
  PrimReserve(this,iVar26 * uVar22,local_64);
  uVar23 = local_48;
  bVar17 = (byte)local_34 | local_58._0_1_;
  lVar25 = -((ulong)(((uint)(bVar17 ^ 1) * 2 + 3) * (int)local_88.x) * 8 + 0xf & 0xfffffffffffffff0)
  ;
  puVar19 = (undefined8 *)((long)&local_98 + lVar25);
  lVar31 = -(long)local_40;
  for (; lVar31 + uVar18 != 1; uVar18 = uVar18 + 1) {
    uVar24 = uVar18 & 0xffffffff;
    if (uVar23 == uVar18) {
      uVar24 = 0;
    }
    fVar3 = points[uVar24].x - points[uVar18 - 1].x;
    fVar4 = points[uVar24].y - points[uVar18 - 1].y;
    fVar8 = fVar3 * fVar3 + fVar4 * fVar4;
    if (0.0 < fVar8) {
      fVar8 = 1.0 / SQRT(fVar8);
      fVar3 = fVar3 * fVar8;
      fVar4 = fVar4 * fVar8;
    }
    *(float *)((long)&uStack_a0 + uVar18 * 8 + lVar25) = fVar4;
    *(float *)((long)&uStack_a0 + uVar18 * 8 + lVar25 + 4) = -fVar3;
  }
  local_34 = col & 0xffffff;
  pfVar1 = (float *)(puVar19 + uVar23);
  local_40 = pfVar1;
  if ((char)local_60 == '\0') {
    uVar18 = (ulong)local_80 & 0xffffffff;
    puVar19[uVar18] = *(undefined8 *)(pfVar1 + -4);
    fVar3 = points[uVar18].x;
    fVar4 = points[uVar18].y;
    fVar8 = 1.0;
    if (bVar17 == 0) {
      fVar9 = (local_78 + -1.0) * 0.5;
      fVar8 = fVar9 + 1.0;
      fVar35 = (float)*puVar19;
      fVar39 = (float)((ulong)*puVar19 >> 0x20);
      fVar38 = fVar35 * fVar8;
      fVar36 = fVar39 * fVar8;
      fVar37 = (*points).x;
      fVar40 = (*points).y;
      fVar35 = fVar35 * fVar9;
      fVar39 = fVar39 * fVar9;
      *pfVar1 = fVar38 + fVar37;
      pfVar1[1] = fVar36 + fVar40;
      pfVar1[2] = fVar35 + fVar37;
      pfVar1[3] = fVar39 + fVar40;
      pfVar1[4] = fVar37 - fVar35;
      pfVar1[5] = fVar40 - fVar39;
      pfVar1[6] = fVar37 - fVar38;
      pfVar1[7] = fVar40 - fVar36;
      uVar23 = (ulong)(uint)((int)local_80.x << 2);
      *(ulong *)(pfVar1 + uVar23 * 2) =
           CONCAT44((float)((ulong)puVar19[uVar18] >> 0x20) * fVar8 + fVar4,
                    (float)puVar19[uVar18] * fVar8 + fVar3);
      *(ulong *)(pfVar1 + uVar23 * 2 + 2) =
           CONCAT44((float)((ulong)puVar19[uVar18] >> 0x20) * fVar9 + fVar4,
                    (float)puVar19[uVar18] * fVar9 + fVar3);
      *(ulong *)(pfVar1 + uVar23 * 2 + 4) =
           CONCAT44(fVar4 - (float)((ulong)puVar19[uVar18] >> 0x20) * fVar9,
                    fVar3 - (float)puVar19[uVar18] * fVar9);
      *(ulong *)(pfVar1 + uVar23 * 2 + 6) =
           CONCAT44(fVar4 - (float)((ulong)puVar19[uVar18] >> 0x20) * fVar8,
                    fVar3 - (float)puVar19[uVar18] * fVar8);
      goto LAB_00140d7b;
    }
    if (local_58._0_1_ != '\0') {
      fVar8 = local_78 * 0.5 + 1.0;
    }
    local_40 = (float *)lVar31;
    fVar9 = (float)*puVar19 * fVar8;
    fVar35 = (float)((ulong)*puVar19 >> 0x20) * fVar8;
    fVar39 = (*points).x;
    fVar38 = (*points).y;
    *pfVar1 = fVar9 + fVar39;
    pfVar1[1] = fVar35 + fVar38;
    pfVar1[2] = fVar39 - fVar9;
    pfVar1[3] = fVar38 - fVar35;
    uVar24 = (ulong)(uint)((int)local_80.x * 2);
    *(ulong *)(pfVar1 + uVar24 * 2) =
         CONCAT44((float)((ulong)puVar19[uVar18] >> 0x20) * fVar8 + fVar4,
                  (float)puVar19[uVar18] * fVar8 + fVar3);
    *(ulong *)(pfVar1 + uVar24 * 2 + 2) =
         CONCAT44(fVar4 - (float)((ulong)puVar19[uVar18] >> 0x20) * fVar8,
                  fVar3 - (float)puVar19[uVar18] * fVar8);
  }
  else {
    if (bVar17 == 0) {
      fVar9 = (local_78 + -1.0) * 0.5;
      fVar8 = fVar9 + 1.0;
LAB_00140d7b:
      uVar22 = this->_VtxCurrentIdx;
      pIVar28 = this->_IdxWritePtr;
      *(undefined8 *)((long)&uStack_a0 + lVar25) = 1;
      for (uVar18 = *(ulong *)((long)&uStack_a0 + lVar25); lVar31 + uVar18 != 1; uVar18 = uVar18 + 1
          ) {
        uVar23 = uVar18 & 0xffffffff;
        if (local_48 == uVar18) {
          uVar23 = 0;
        }
        uVar27 = uVar22 + 4;
        if (local_48 == uVar18) {
          uVar27 = this->_VtxCurrentIdx;
        }
        uVar7 = *(undefined8 *)((long)&uStack_a0 + uVar18 * 8 + lVar25);
        fVar4 = ((float)puVar19[uVar23] + (float)uVar7) * 0.5;
        fVar35 = ((float)((ulong)puVar19[uVar23] >> 0x20) + (float)((ulong)uVar7 >> 0x20)) * 0.5;
        fVar39 = fVar4 * fVar4 + fVar35 * fVar35;
        fVar3 = 0.5;
        if (0.5 <= fVar39) {
          fVar3 = fVar39;
        }
        fVar3 = 1.0 / fVar3;
        fVar36 = points[uVar23].x;
        fVar37 = points[uVar23].y;
        uVar23 = (ulong)(uint)((int)uVar23 << 2);
        fVar39 = fVar4 * fVar3 * fVar8;
        fVar38 = fVar35 * fVar3 * fVar8;
        fVar4 = fVar4 * fVar3 * fVar9;
        fVar3 = fVar35 * fVar3 * fVar9;
        pfVar1 = local_40 + uVar23 * 2;
        *pfVar1 = fVar36 + fVar39;
        pfVar1[1] = fVar37 + fVar38;
        pfVar1[2] = fVar36 + fVar4;
        pfVar1[3] = fVar37 + fVar3;
        pfVar1 = local_40 + uVar23 * 2 + 4;
        *pfVar1 = fVar36 - fVar4;
        pfVar1[1] = fVar37 - fVar3;
        pfVar1[2] = fVar36 - fVar39;
        pfVar1[3] = fVar37 - fVar38;
        IVar21 = (ImDrawIdx)uVar27;
        IVar30 = IVar21 + 1;
        *pIVar28 = IVar30;
        IVar32 = (ImDrawIdx)uVar22;
        pIVar28[1] = IVar32 + 1;
        IVar29 = IVar32 + 2;
        pIVar28[2] = IVar29;
        pIVar28[3] = IVar29;
        IVar20 = IVar21 + 2;
        pIVar28[4] = IVar20;
        pIVar28[5] = IVar30;
        pIVar28[6] = IVar30;
        pIVar28[7] = IVar32 + 1;
        pIVar28[8] = IVar32;
        pIVar28[9] = IVar32;
        pIVar28[10] = IVar21;
        pIVar28[0xb] = IVar30;
        pIVar28[0xc] = IVar20;
        pIVar28[0xd] = IVar29;
        pIVar28[0xe] = IVar32 + 3;
        pIVar28[0xf] = IVar32 + 3;
        pIVar28[0x10] = IVar21 + 3;
        pIVar28[0x11] = IVar20;
        pIVar28 = pIVar28 + 0x12;
        this->_IdxWritePtr = pIVar28;
        uVar22 = uVar27;
      }
      for (lVar25 = 0; local_48 << 5 != lVar25; lVar25 = lVar25 + 0x20) {
        this->_VtxWritePtr->pos = *(ImVec2 *)((long)puVar19 + lVar25 + local_48 * 8);
        this->_VtxWritePtr->uv = IVar12;
        pIVar13 = this->_VtxWritePtr;
        pIVar13->col = local_34;
        pIVar13[1].pos = *(ImVec2 *)((long)puVar19 + lVar25 + local_48 * 8 + 8);
        this->_VtxWritePtr[1].uv = IVar12;
        pIVar13 = this->_VtxWritePtr;
        pIVar13[1].col = col;
        pIVar13[2].pos = *(ImVec2 *)((long)puVar19 + lVar25 + local_48 * 8 + 0x10);
        this->_VtxWritePtr[2].uv = IVar12;
        pIVar13 = this->_VtxWritePtr;
        pIVar13[2].col = col;
        pIVar13[3].pos = *(ImVec2 *)((long)puVar19 + lVar25 + local_48 * 8 + 0x18);
        this->_VtxWritePtr[3].uv = IVar12;
        pIVar13 = this->_VtxWritePtr;
        pIVar13[3].col = local_34;
        this->_VtxWritePtr = pIVar13 + 4;
      }
      goto LAB_00140fbe;
    }
    fVar8 = 1.0;
    if (local_58._0_1_ != '\0') {
      fVar8 = local_78 * 0.5 + 1.0;
    }
    local_40 = (float *)lVar31;
  }
  uVar22 = this->_VtxCurrentIdx;
  uVar27 = (uint)local_58 & 0xff;
  pIVar28 = this->_IdxWritePtr;
  *(undefined8 *)((long)&uStack_a0 + lVar25) = 1;
  for (uVar18 = *(ulong *)((long)&uStack_a0 + lVar25); (long)local_40 + uVar18 != 1;
      uVar18 = uVar18 + 1) {
    uVar24 = uVar18 & 0xffffffff;
    if (uVar23 == uVar18) {
      uVar24 = 0;
    }
    uVar33 = uVar22 + (uVar27 ^ 3);
    if (uVar23 == uVar18) {
      uVar33 = this->_VtxCurrentIdx;
    }
    fVar35 = points[uVar24].x;
    fVar39 = points[uVar24].y;
    uVar7 = *(undefined8 *)((long)&uStack_a0 + uVar18 * 8 + lVar25);
    fVar4 = ((float)puVar19[uVar24] + (float)uVar7) * 0.5;
    fVar9 = ((float)((ulong)puVar19[uVar24] >> 0x20) + (float)((ulong)uVar7 >> 0x20)) * 0.5;
    fVar38 = fVar4 * fVar4 + fVar9 * fVar9;
    fVar3 = 0.5;
    if (0.5 <= fVar38) {
      fVar3 = fVar38;
    }
    fVar4 = (1.0 / fVar3) * fVar4 * fVar8;
    fVar3 = (1.0 / fVar3) * fVar9 * fVar8;
    pfVar2 = pfVar1 + (ulong)(uint)((int)uVar24 * 2) * 2;
    *pfVar2 = fVar4 + fVar35;
    pfVar2[1] = fVar3 + fVar39;
    pfVar2[2] = fVar35 - fVar4;
    pfVar2[3] = fVar39 - fVar3;
    uVar24 = local_48;
    IVar32 = (ImDrawIdx)uVar33;
    *pIVar28 = IVar32;
    IVar21 = (ImDrawIdx)uVar22;
    pIVar28[1] = IVar21;
    if (local_58._0_1_ == '\0') {
      pIVar28[2] = IVar21 + 2;
      pIVar28[3] = IVar21 + 2;
      pIVar28[4] = IVar32 + 2;
      pIVar28[5] = IVar32;
      pIVar28[6] = IVar32 + 1;
      pIVar28[7] = IVar21 + 1;
      pIVar28[8] = IVar21;
      pIVar28[9] = IVar21;
      pIVar28[10] = IVar32;
      pIVar28[0xb] = IVar32 + 1;
      *(undefined8 *)((long)&uStack_a0 + lVar25) = 0x18;
    }
    else {
      pIVar28[2] = IVar21 + 1;
      pIVar28[3] = IVar32 + 1;
      pIVar28[4] = IVar21 + 1;
      pIVar28[5] = IVar32;
      *(undefined8 *)((long)&uStack_a0 + lVar25) = 0xc;
      uVar24 = uVar23;
    }
    pIVar28 = (ImDrawIdx *)((long)pIVar28 + *(long *)((long)&uStack_a0 + lVar25));
    this->_IdxWritePtr = pIVar28;
    uVar23 = uVar24;
    uVar22 = uVar33;
  }
  if (local_58._0_1_ == '\0') {
    for (lVar25 = 0; uVar23 * 8 - lVar25 != 0; lVar25 = lVar25 + 8) {
      this->_VtxWritePtr->pos = *(ImVec2 *)((long)&points->x + lVar25);
      this->_VtxWritePtr->uv = IVar12;
      pIVar13 = this->_VtxWritePtr;
      pIVar13->col = col;
      pIVar13[1].pos = *(ImVec2 *)((long)puVar19 + lVar25 * 2 + uVar23 * 8);
      this->_VtxWritePtr[1].uv = IVar12;
      pIVar13 = this->_VtxWritePtr;
      pIVar13[1].col = local_34;
      pIVar13[2].pos = *(ImVec2 *)((long)puVar19 + lVar25 * 2 + uVar23 * 8 + 8);
      this->_VtxWritePtr[2].uv = IVar12;
      pIVar13 = this->_VtxWritePtr;
      pIVar13[2].col = local_34;
      this->_VtxWritePtr = pIVar13 + 3;
    }
  }
  else {
    pIVar14 = this->_Data->TexUvLines;
    lVar25 = (long)local_5c;
    fVar3 = pIVar14[lVar25].x;
    fVar8 = pIVar14[lVar25].y;
    fVar4 = pIVar14[lVar25].z;
    fVar9 = pIVar14[lVar25].w;
    if ((local_98.x != 0.0) || (NAN(local_98.x))) {
      uVar5 = pIVar14[lVar25 + 1].x;
      uVar10 = pIVar14[lVar25 + 1].y;
      uVar6 = pIVar14[lVar25 + 1].z;
      uVar11 = pIVar14[lVar25 + 1].w;
      fVar3 = fVar3 + ((float)uVar5 - fVar3) * local_98.x;
      fVar8 = fVar8 + ((float)uVar10 - fVar8) * local_98.x;
      fVar4 = fVar4 + ((float)uVar6 - fVar4) * local_98.x;
      fVar9 = fVar9 + ((float)uVar11 - fVar9) * local_98.x;
    }
    for (lVar25 = 0; uVar23 * 0x10 != lVar25; lVar25 = lVar25 + 0x10) {
      this->_VtxWritePtr->pos = *(ImVec2 *)((long)puVar19 + lVar25 + uVar23 * 8);
      IVar12.y = fVar8;
      IVar12.x = fVar3;
      this->_VtxWritePtr->uv = IVar12;
      pIVar13 = this->_VtxWritePtr;
      pIVar13->col = col;
      pIVar13[1].pos = *(ImVec2 *)((long)puVar19 + lVar25 + uVar23 * 8 + 8);
      IVar16.y = fVar9;
      IVar16.x = fVar4;
      this->_VtxWritePtr[1].uv = IVar16;
      pIVar13 = this->_VtxWritePtr;
      pIVar13[1].col = col;
      this->_VtxWritePtr = pIVar13 + 2;
    }
  }
LAB_00140fbe:
  this->_VtxCurrentIdx = this->_VtxCurrentIdx + (uint)(ushort)local_64;
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 opaque_uv = _Data->TexUvWhitePixel;
    const int count = closed ? points_count : points_count - 1; // The number of line segments we need to draw
    const bool thick_line = (thickness > 1.0f);

    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        // Thicknesses <1.0 should behave like thickness 1.0
        thickness = ImMax(thickness, 1.0f);
        const int integer_thickness = (int)thickness;
        const float fractional_thickness = thickness - integer_thickness;

        // Do we want to draw this line using a texture?
        // - For now, only draw integer-width lines using textures to avoid issues with the way scaling occurs, could be improved.
        // - If AA_SIZE is not 1.0f we cannot use the texture path.
        const bool use_texture = (Flags & ImDrawListFlags_AntiAliasedLinesUseTex) && (integer_thickness < IM_DRAWLIST_TEX_LINES_WIDTH_MAX) && (fractional_thickness <= 0.00001f);

        // We should never hit this, because NewFrame() doesn't set ImDrawListFlags_AntiAliasedLinesUseTex unless ImFontAtlasFlags_NoBakedLines is off
        IM_ASSERT_PARANOID(!use_texture || !(_Data->Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines));

        const int idx_count = use_texture ? (count * 6) : (thick_line ? count * 18 : count * 12);
        const int vtx_count = use_texture ? (points_count * 2) : (thick_line ? points_count * 4 : points_count * 3);
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        // The first <points_count> items are normals at each line point, then after that there are either 2 or 4 temp points for each line point
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * ((use_texture || !thick_line) ? 3 : 5) * sizeof(ImVec2)); //-V630
        ImVec2* temp_points = temp_normals + points_count;

        // Calculate normals (tangents) for each line segment
        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count - 1] = temp_normals[points_count - 2];

        // If we are drawing a one-pixel-wide line without a texture, or a textured line of any width, we only need 2 or 3 vertices per point
        if (use_texture || !thick_line)
        {
            // [PATH 1] Texture-based lines (thick or non-thick)
            // [PATH 2] Non texture-based lines (non-thick)

            // The width of the geometry we need to draw - this is essentially <thickness> pixels for the line itself, plus "one pixel" for AA.
            // - In the texture-based path, we don't use AA_SIZE here because the +1 is tied to the generated texture
            //   (see ImFontAtlasBuildRenderLinesTexData() function), and so alternate values won't work without changes to that code.
            // - In the non texture-based paths, we would allow AA_SIZE to potentially be != 1.0f with a patch (e.g. fringe_scale patch to
            //   allow scaling geometry while preserving one-screen-pixel AA fringe).
            const float half_draw_size = use_texture ? ((thickness * 0.5f) + 1) : AA_SIZE;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * half_draw_size;
                temp_points[1] = points[0] - temp_normals[0] * half_draw_size;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * half_draw_size;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * half_draw_size;
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1; // i2 is the second point of the line segment
                const unsigned int idx2 = ((i1 + 1) == points_count) ? _VtxCurrentIdx : (idx1 + (use_texture ? 2 : 3)); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                dm_x *= half_draw_size; // dm_x, dm_y are offset to the outer edge of the AA area
                dm_y *= half_draw_size;

                // Add temporary vertexes for the outer edges
                ImVec2* out_vtx = &temp_points[i2 * 2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                if (use_texture)
                {
                    // Add indices for two triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 1); // Right tri
                    _IdxWritePtr[3] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[4] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Left tri
                    _IdxWritePtr += 6;
                }
                else
                {
                    // Add indexes for four triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 2); // Right tri 1
                    _IdxWritePtr[3] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Right tri 2
                    _IdxWritePtr[6] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8] = (ImDrawIdx)(idx1 + 0); // Left tri 1
                    _IdxWritePtr[9] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1); // Left tri 2
                    _IdxWritePtr += 12;
                }

                idx1 = idx2;
            }

            // Add vertexes for each point on the line
            if (use_texture)
            {
                // If we're using textures we only need to emit the left/right edge vertices
                ImVec4 tex_uvs = _Data->TexUvLines[integer_thickness];
                if (fractional_thickness != 0.0f)
                {
                    const ImVec4 tex_uvs_1 = _Data->TexUvLines[integer_thickness + 1];
                    tex_uvs.x = tex_uvs.x + (tex_uvs_1.x - tex_uvs.x) * fractional_thickness; // inlined ImLerp()
                    tex_uvs.y = tex_uvs.y + (tex_uvs_1.y - tex_uvs.y) * fractional_thickness;
                    tex_uvs.z = tex_uvs.z + (tex_uvs_1.z - tex_uvs.z) * fractional_thickness;
                    tex_uvs.w = tex_uvs.w + (tex_uvs_1.w - tex_uvs.w) * fractional_thickness;
                }
                ImVec2 tex_uv0(tex_uvs.x, tex_uvs.y);
                ImVec2 tex_uv1(tex_uvs.z, tex_uvs.w);
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = temp_points[i * 2 + 0]; _VtxWritePtr[0].uv = tex_uv0; _VtxWritePtr[0].col = col; // Left-side outer edge
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 1]; _VtxWritePtr[1].uv = tex_uv1; _VtxWritePtr[1].col = col; // Right-side outer edge
                    _VtxWritePtr += 2;
                }
            }
            else
            {
                // If we're not using a texture, we need the center vertex as well
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = points[i];              _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;       // Center of line
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 0]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col_trans; // Left-side outer edge
                    _VtxWritePtr[2].pos = temp_points[i * 2 + 1]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col_trans; // Right-side outer edge
                    _VtxWritePtr += 3;
                }
            }
        }
        else
        {
            // [PATH 2] Non texture-based lines (thick): we need to draw the solid line core and thus require four vertices per point
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                const int points_last = points_count - 1;
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 0] = points[points_last] + temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 1] = points[points_last] + temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 2] = points[points_last] - temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 3] = points[points_last] - temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : (i1 + 1); // i2 is the second point of the line segment
                const unsigned int idx2 = (i1 + 1) == points_count ? _VtxCurrentIdx : (idx1 + 4); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertices
                ImVec2* out_vtx = &temp_points[i2 * 4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1 + 2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1 + 0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[13] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[14] = (ImDrawIdx)(idx1 + 3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1 + 3); _IdxWritePtr[16] = (ImDrawIdx)(idx2 + 3); _IdxWritePtr[17] = (ImDrawIdx)(idx2 + 2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertices
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i * 4 + 0]; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i * 4 + 1]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i * 4 + 2]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i * 4 + 3]; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // [PATH 4] Non texture-based, Non anti-aliased lines
        const int idx_count = count * 6;
        const int vtx_count = count * 4;    // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + 2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + 2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + 3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}